

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equalsi<char8_t,char8_t>
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs)

{
  int iVar1;
  int iVar2;
  jessilib *pjVar3;
  jessilib *extraout_RDX;
  char8_t *pcVar5;
  jessilib *this;
  jessilib *this_00;
  char8_t *pcVar6;
  bool bVar7;
  decode_result dVar8;
  decode_result dVar9;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  jessilib *pjVar4;
  
  pcVar5 = lhs._M_str;
  this = (jessilib *)lhs._M_len;
  pcVar6 = rhs._M_str;
  pjVar3 = (jessilib *)rhs._M_len;
  if (this != pjVar3) {
    return false;
  }
  this_00 = this;
  if (this == (jessilib *)0x0) {
    bVar7 = true;
  }
  else {
    do {
      if (this_00 == (jessilib *)0x0) {
        return false;
      }
      in_string._M_str = (char8_t *)pjVar3;
      in_string._M_len = (size_t)pcVar5;
      dVar8 = decode_codepoint_utf8<char8_t>(this,in_string);
      in_string_00._M_str = (char8_t *)dVar8.units;
      in_string_00._M_len = (size_t)pcVar6;
      dVar9 = decode_codepoint_utf8<char8_t>(this_00,in_string_00);
      pjVar4 = (jessilib *)dVar9.units;
      if (in_string_00._M_str == (char8_t *)0x0) {
        return false;
      }
      if (pjVar4 == (jessilib *)0x0) {
        return false;
      }
      pjVar3 = pjVar4;
      if (dVar8.codepoint != dVar9.codepoint) {
        iVar1 = jessilib::fold(dVar8.codepoint);
        iVar2 = jessilib::fold(dVar9.codepoint);
        pjVar3 = extraout_RDX;
        if (iVar1 != iVar2) {
          return false;
        }
      }
      pcVar5 = pcVar5 + (long)in_string_00._M_str;
      pcVar6 = pcVar6 + (long)pjVar4;
      this_00 = this_00 + -(long)pjVar4;
      this = this + -(long)in_string_00._M_str;
    } while (this != (jessilib *)0x0);
    bVar7 = this_00 == (jessilib *)0x0;
  }
  return bVar7;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}